

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall
testing::Action<void_(SDL_Renderer_*)>::Perform
          (Action<void_(SDL_Renderer_*)> *this,ArgumentTuple *args)

{
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  internal::ApplyImpl<std::function<void(SDL_Renderer*)>const&,std::tuple<SDL_Renderer*>,0ul>
            (this,args);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }